

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O3

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  ulong uVar2;
  float *pfVar3;
  uint uVar4;
  float *pfVar5;
  undefined1 (*pauVar6) [32];
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  
  uVar1 = a->c;
  uVar4 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar7 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar1) {
      uVar2 = 0;
      do {
        pfVar3 = (float *)(a->cstep * uVar2 * a->elemsize + (long)a->data);
        pfVar5 = (float *)(b->cstep * uVar2 * b->elemsize + (long)b->data);
        pauVar6 = (undefined1 (*) [32])(c->cstep * uVar2 * c->elemsize + (long)c->data);
        if ((int)uVar4 < 8) {
          uVar8 = 0;
        }
        else {
          iVar7 = 7;
          do {
            auVar12._0_4_ = *pfVar5 + *pfVar3;
            auVar12._4_4_ = pfVar5[1] + pfVar3[1];
            auVar12._8_4_ = pfVar5[2] + pfVar3[2];
            auVar12._12_4_ = pfVar5[3] + pfVar3[3];
            auVar12._16_4_ = pfVar5[4] + pfVar3[4];
            auVar12._20_4_ = pfVar5[5] + pfVar3[5];
            auVar12._24_4_ = pfVar5[6] + pfVar3[6];
            auVar12._28_4_ = pfVar5[7] + pfVar3[7];
            *pauVar6 = auVar12;
            pfVar3 = pfVar3 + 8;
            pfVar5 = pfVar5 + 8;
            pauVar6 = pauVar6 + 1;
            iVar7 = iVar7 + 8;
            uVar8 = uVar4 & 0xfffffff8;
          } while (iVar7 < (int)uVar4);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar4) {
          auVar11._0_4_ = *pfVar5 + *pfVar3;
          auVar11._4_4_ = pfVar5[1] + pfVar3[1];
          auVar11._8_4_ = pfVar5[2] + pfVar3[2];
          auVar11._12_4_ = pfVar5[3] + pfVar3[3];
          *(undefined1 (*) [16])*pauVar6 = auVar11;
          pfVar3 = pfVar3 + 4;
          pfVar5 = pfVar5 + 4;
          pauVar6 = (undefined1 (*) [32])((long)*pauVar6 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if (uVar4 - uVar8 != 0 && (int)uVar8 <= (int)uVar4) {
          lVar9 = 0;
          do {
            *(float *)((long)*pauVar6 + lVar9 * 4) = pfVar5[lVar9] + pfVar3[lVar9];
            lVar9 = lVar9 + 1;
          } while (uVar4 - uVar8 != (int)lVar9);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != uVar1);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}